

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

int assert_non_null(void *v,char *testcase,int line)

{
  test_counter = test_counter + 1;
  if (v == (void *)0x0) {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
    printf("# Expected Non-NULL value, but observed NULL instead (line %d)\n",(ulong)(uint)line);
    global_err = global_err + 1;
  }
  else {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
  }
  return (uint)(v == (void *)0x0);
}

Assistant:

int assert_non_null(const void *v, const char *testcase, int line)
{
    test_counter++;
    int err = !v;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected Non-NULL value, but observed NULL instead (line %d)\n", line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}